

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O2

string * __thiscall
flatbuffers::kotlin::KotlinGenerator::GenFBBDefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,KotlinGenerator *this,FieldDef *field)

{
  BaseType BVar1;
  long lVar2;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  
  BVar1 = (field->value).type.base_type;
  if ((BVar1 - BASE_TYPE_UTYPE < 0xc) && (field->presence == kOptional)) {
    if (BVar1 - BASE_TYPE_FLOAT < 2) {
      __s = "0.0";
      __a = &local_11;
    }
    else if (BVar1 == BASE_TYPE_BOOL) {
      __s = "false";
      __a = &local_12;
    }
    else {
      __s = "0";
      __a = &local_13;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  }
  else {
    GenDefaultValue_abi_cxx11_(__return_storage_ptr__,this,field,true);
    if ((field->value).type.base_type == BASE_TYPE_FLOAT) {
      lVar2 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x26bfa8);
      if (lVar2 != -1) {
        std::__cxx11::string::replace((ulong)__return_storage_ptr__,0,(char *)0x5);
      }
    }
    if ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] ==
        'f') {
      std::__cxx11::string::pop_back();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenFBBDefaultValue(const FieldDef &field) const {
    if (field.IsScalarOptional()) {
      // although default value is null, java API forces us to present a real
      // default value for scalars, while adding a field to the buffer. This is
      // not a problem because the default can be representing just by not
      // calling builder.addMyField()
      switch (field.value.type.base_type) {
        case BASE_TYPE_DOUBLE:
        case BASE_TYPE_FLOAT: return "0.0";
        case BASE_TYPE_BOOL: return "false";
        default: return "0";
      }
    }
    auto out = GenDefaultValue(field, true);
    // All FlatBufferBuilder default floating point values are doubles
    if (field.value.type.base_type == BASE_TYPE_FLOAT) {
      if (out.find("Float") != std::string::npos) {
        out.replace(0, 5, "Double");
      }
    }
    // Guarantee all values are doubles
    if (out.back() == 'f') out.pop_back();
    return out;
  }